

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::asStringTest<false>(ViewTest *this)

{
  View<int,_false,_std::allocator<unsigned_long>_> w;
  size_t shape [3];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  stringstream s;
  StringStyle local_26c;
  string local_268;
  undefined1 local_248 [64];
  unsigned_long local_208 [4];
  View<int,false,std::allocator<unsigned_long>> local_1e8 [8];
  Geometry<std::allocator<unsigned_long>_> local_1e0;
  allocator_type local_1a8 [16];
  ostream local_198 [376];
  
  local_208[0] = 3;
  local_208[1] = 2;
  local_208[2] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            (local_1e8,local_208,local_208 + 3,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,local_1a8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  local_268._M_dataplus._M_p._0_4_ = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::asString_abi_cxx11_
            ((string *)local_248,local_1e8,(StringStyle *)&local_268);
  std::operator<<(local_198,(string *)local_248);
  std::__cxx11::string::~string((string *)local_248);
  local_268._M_dataplus._M_p._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::asString_abi_cxx11_
            ((string *)local_248,local_1e8,(StringStyle *)&local_268);
  std::operator<<(local_198,(string *)local_248);
  std::__cxx11::string::~string((string *)local_248);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)local_248,local_208,local_208 + 3,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_268);
  local_26c = MatrixStyle;
  andres::View<int,false,std::allocator<unsigned_long>>::asString_abi_cxx11_
            (&local_268,(View<int,false,std::allocator<unsigned_long>> *)local_248,&local_26c);
  std::operator<<(local_198,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  local_26c = TableStyle;
  andres::View<int,false,std::allocator<unsigned_long>>::asString_abi_cxx11_
            (&local_268,(View<int,false,std::allocator<unsigned_long>> *)local_248,&local_26c);
  std::operator<<(local_198,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)(local_248 + 8));
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_1e0);
  return;
}

Assistant:

void ViewTest::asStringTest()
{
    {
        std::size_t shape[3] = {3, 2, 4};

        andres::View<int, constTarget> v(&shape[0], &shape[3], data_);
        std::stringstream s;
        s << v.asString(andres::MatrixStyle);
        s << v.asString(andres::TableStyle);

        const andres::View<int, constTarget> w(&shape[0], &shape[3], data_);
        s << w.asString(andres::MatrixStyle);
        s << w.asString(andres::TableStyle);
    }
}